

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_vector_length(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t lab;
  operand local_d4;
  operation local_d0 [2];
  operand local_c8 [2];
  operation local_c0;
  operand local_bc [2];
  operation local_b4;
  long local_b0;
  operand local_a8 [2];
  operation local_a0;
  operand local_9c [2];
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  this = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,this,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_short_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_short_if_arg_does_not_point_to_vector(code,RCX,R11,(string *)local_38);
  }
  local_94 = MOV;
  local_9c[1] = 9;
  local_9c[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_94,local_9c + 1,local_9c);
  local_a0 = MOV;
  local_a8[1] = 0x14;
  local_a8[0] = NUMBER;
  local_b0 = 0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,&local_a0,local_a8 + 1,local_a8,&local_b0);
  local_b4 = AND;
  local_bc[1] = 9;
  local_bc[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_b4,local_bc + 1,local_bc);
  local_c0 = SHL;
  local_c8[1] = 9;
  local_c8[0] = NUMBER;
  local_d0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_c0,local_c8 + 1,local_c8,(int *)(local_d0 + 1));
  local_d0[0] = JMP;
  local_d4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_d0,&local_d4);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_vector_length_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_vector_length(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_vector(code, asmcode::RCX, asmcode::R11, error);
    }
  //code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::RAX, asmcode::R11);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_vector_length_contract_violation);
    }
  }